

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O2

void Amap_ManCutSaveStored(Amap_Man_t *p,Amap_Obj_t *pNode)

{
  uint uVar1;
  Vec_Int_t *p_00;
  int iVar2;
  uint *puVar3;
  Amap_Cut_t *pAVar4;
  ulong uVar5;
  long lVar6;
  uint *puVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  bool bVar13;
  
  if ((pNode->field_11).pData != (void *)0x0) {
    __assert_fail("pNode->pData == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/amap/amapMerge.c"
                  ,0xb4,"void Amap_ManCutSaveStored(Amap_Man_t *, Amap_Obj_t *)");
  }
  uVar1 = p->pPars->nCutsMax;
  uVar12 = 1;
  iVar10 = 2;
  for (iVar8 = 0; iVar8 < p->vTemp->nSize; iVar8 = iVar8 + 1) {
    iVar2 = Vec_IntEntry(p->vTemp,iVar8);
    for (pAVar4 = (Amap_Cut_t *)(p->ppCutsTemp + iVar2); pAVar4 = *(Amap_Cut_t **)pAVar4,
        pAVar4 != (Amap_Cut_t *)0x0; pAVar4 = pAVar4 + (ulong)((uint)*pAVar4 >> 0x11) + 1) {
      uVar12 = uVar12 + 1;
      iVar2 = iVar10 + 1 + ((uint)*pAVar4 >> 0x11);
      if ((int)uVar1 <= (int)uVar12) {
        iVar2 = iVar10;
      }
      iVar10 = iVar2;
    }
  }
  p->nBytesUsed = p->nBytesUsed + iVar10 * 4;
  puVar3 = (uint *)Aig_MmFlexEntryFetch(p->pMemCuts,iVar10 * 4);
  *puVar3 = 0x20000;
  puVar3[1] = *(uint *)pNode >> 2 & 0xfffffffe;
  puVar7 = puVar3 + 2;
  uVar9 = 1;
  for (iVar8 = 0; p_00 = p->vTemp, iVar8 < p_00->nSize; iVar8 = iVar8 + 1) {
    iVar2 = Vec_IntEntry(p_00,iVar8);
    for (pAVar4 = (Amap_Cut_t *)(p->ppCutsTemp + iVar2); pAVar4 = *(Amap_Cut_t **)pAVar4,
        pAVar4 != (Amap_Cut_t *)0x0; pAVar4 = pAVar4 + uVar5 + 1) {
      uVar9 = uVar9 + 1;
      uVar5 = (ulong)((uint)*pAVar4 >> 0x11);
      if ((int)uVar9 < (int)uVar1) {
        memcpy(puVar7,pAVar4,(ulong)(((uint)*pAVar4 >> 0x11) * 4 + 4));
        uVar5 = (ulong)((uint)*pAVar4 >> 0x11);
        puVar7 = puVar7 + uVar5 + 1;
      }
    }
    p->ppCutsTemp[iVar2] = (Amap_Cut_t *)0x0;
  }
  if (uVar12 != uVar9) {
    __assert_fail("nCuts == nCuts2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/amap/amapMerge.c"
                  ,0xda,"void Amap_ManCutSaveStored(Amap_Man_t *, Amap_Obj_t *)");
  }
  if ((long)puVar7 - (long)puVar3 >> 2 != (long)iVar10) {
    __assert_fail("(int *)pNext - pBuffer == nWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/amap/amapMerge.c"
                  ,0xdb,"void Amap_ManCutSaveStored(Amap_Man_t *, Amap_Obj_t *)");
  }
  p_00->nSize = 0;
  Aig_MmFlexRestart(p->pMemTemp);
  for (lVar11 = 0; lVar6 = (long)p->pLib->nNodes,
      SBORROW8(lVar11,lVar6 * 2) != lVar11 + lVar6 * -2 < 0; lVar11 = lVar11 + 1) {
    if (p->ppCutsTemp[lVar11] != (Amap_Cut_t *)0x0) {
      puts("Amap_ManCutSaveStored(): Error!");
    }
  }
  (pNode->field_11).pData = puVar3;
  uVar9 = uVar1 - 1;
  if ((int)uVar12 < (int)(uVar1 - 1)) {
    uVar9 = uVar12;
  }
  pNode->nCuts = uVar9;
  if ((int)uVar12 < 0x100000) {
    if ((int)uVar9 < 1) {
      uVar9 = 0;
    }
    puVar7 = (uint *)0x0;
    if (uVar1 < uVar9) {
      uVar9 = uVar1;
    }
    while( true ) {
      bVar13 = uVar9 == 0;
      uVar9 = uVar9 - 1;
      if (bVar13) {
        return;
      }
      if ((puVar7 != (uint *)0x0) && ((*puVar3 & 0xffff) < (uint)(ushort)*puVar7)) break;
      puVar7 = puVar3;
      puVar3 = puVar3 + (ulong)(*puVar3 >> 0x11) + 1;
    }
    __assert_fail("pCut == NULL || pCut->iMat <= pNext->iMat",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/amap/amapMerge.c"
                  ,0xee,"void Amap_ManCutSaveStored(Amap_Man_t *, Amap_Obj_t *)");
  }
  __assert_fail("nCuts < (1<<20)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/amap/amapMerge.c"
                ,0xe4,"void Amap_ManCutSaveStored(Amap_Man_t *, Amap_Obj_t *)");
}

Assistant:

void Amap_ManCutSaveStored( Amap_Man_t * p, Amap_Obj_t * pNode )
{
    int nMaxCuts = p->pPars->nCutsMax;
    int * pBuffer;
    Amap_Cut_t * pNext, * pCut;
    int i, nWords, Entry, nCuts, nCuts2;
    assert( pNode->pData == NULL );
    // count memory needed
    nCuts = 1;
    nWords = 2;
    Vec_IntForEachEntry( p->vTemp, Entry, i )
    {
        for ( pCut = p->ppCutsTemp[Entry]; pCut; pCut = *Amap_ManCutNextP(pCut) )
        {
            nCuts++;
            if ( nCuts < nMaxCuts )
                nWords += pCut->nFans + 1;
        }
    }
    p->nBytesUsed += 4*nWords;
    // allocate memory
    pBuffer = (int *)Aig_MmFlexEntryFetch( p->pMemCuts, 4*nWords );
    pNext = (Amap_Cut_t *)pBuffer;
    // add the first cut
    pNext->iMat  = 0; 
    pNext->fInv  = 0;
    pNext->nFans = 1;
    pNext->Fans[0] = Abc_Var2Lit(pNode->Id, 0);
    pNext  = (Amap_Cut_t *)(pBuffer + 2);
    // add other cuts
    nCuts2 = 1;
    Vec_IntForEachEntry( p->vTemp, Entry, i )
    {
        for ( pCut = p->ppCutsTemp[Entry]; pCut; pCut = *Amap_ManCutNextP(pCut) )
        {
            nCuts2++;
            if ( nCuts2 < nMaxCuts )
            {
                memcpy( pNext, pCut, sizeof(int) * (pCut->nFans + 1) );
                pNext = (Amap_Cut_t *)((int *)pNext + pCut->nFans + 1);
            }
        }
        p->ppCutsTemp[Entry] = NULL;
    }
    assert( nCuts == nCuts2 );
    assert( (int *)pNext - pBuffer == nWords );
    // restore the storage
    Vec_IntClear( p->vTemp );
    Aig_MmFlexRestart( p->pMemTemp );
    for ( i = 0; i < 2*p->pLib->nNodes; i++ )
        if ( p->ppCutsTemp[i] != NULL )
            printf( "Amap_ManCutSaveStored(): Error!\n" );
    pNode->pData = (Amap_Cut_t *)pBuffer;
    pNode->nCuts = Abc_MinInt( nCuts, nMaxCuts-1 );
    assert( nCuts < (1<<20) );
//    printf("%d ", nCuts );
    // verify cuts
    pCut = NULL;
    Amap_NodeForEachCut( pNode, pNext, i )
//        for ( i = 0, pNext = (Amap_Cut_t *)pNode->pData; i < (int)pNode->nCuts; 
//        i++, pNext = Amap_ManCutNext(pNext) )
    {
        if ( i == nMaxCuts )
            break;
        assert( pCut == NULL || pCut->iMat <= pNext->iMat );
        pCut = pNext;
    }
}